

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmaster.c
# Opt level: O0

void initial_setup(j_compress_ptr cinfo,boolean transcode_only)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  int local_4c;
  int local_48;
  int local_44;
  JDIMENSION jd_samplesperrow;
  long samplesperrow;
  jpeg_component_info *compptr;
  int local_18;
  int ssize;
  int ci;
  boolean transcode_only_local;
  j_compress_ptr cinfo_local;
  
  if (transcode_only == 0) {
    jpeg_calc_jpeg_dimensions(cinfo);
  }
  else {
    jpeg_calc_trans_dimensions(cinfo);
  }
  if ((cinfo->block_size < 1) || (0x10 < cinfo->block_size)) {
    cinfo->err->msg_code = 7;
    (cinfo->err->msg_parm).i[0] = cinfo->block_size;
    (cinfo->err->msg_parm).i[1] = cinfo->block_size;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  switch(cinfo->block_size) {
  case 2:
    cinfo->natural_order = jpeg_natural_order2;
    break;
  case 3:
    cinfo->natural_order = jpeg_natural_order3;
    break;
  case 4:
    cinfo->natural_order = jpeg_natural_order4;
    break;
  case 5:
    cinfo->natural_order = jpeg_natural_order5;
    break;
  case 6:
    cinfo->natural_order = jpeg_natural_order6;
    break;
  case 7:
    cinfo->natural_order = jpeg_natural_order7;
    break;
  default:
    cinfo->natural_order = jpeg_natural_order;
  }
  if (cinfo->block_size < 8) {
    local_44 = cinfo->block_size * cinfo->block_size + -1;
  }
  else {
    local_44 = 0x3f;
  }
  cinfo->lim_Se = local_44;
  if ((((cinfo->jpeg_height == 0) || (cinfo->jpeg_width == 0)) || (cinfo->num_components < 1)) ||
     (cinfo->input_components < 1)) {
    cinfo->err->msg_code = 0x21;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if ((0xffdc < cinfo->jpeg_height) || (0xffdc < cinfo->jpeg_width)) {
    cinfo->err->msg_code = 0x2a;
    (cinfo->err->msg_parm).i[0] = 0xffdc;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  uVar2 = (ulong)cinfo->image_width * (long)cinfo->input_components;
  if ((uVar2 & 0xffffffff) != uVar2) {
    cinfo->err->msg_code = 0x48;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (cinfo->data_precision != 8) {
    cinfo->err->msg_code = 0x10;
    (cinfo->err->msg_parm).i[0] = cinfo->data_precision;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (10 < cinfo->num_components) {
    cinfo->err->msg_code = 0x1b;
    (cinfo->err->msg_parm).i[0] = cinfo->num_components;
    (cinfo->err->msg_parm).i[1] = 10;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  cinfo->max_h_samp_factor = 1;
  cinfo->max_v_samp_factor = 1;
  local_18 = 0;
  samplesperrow = (long)cinfo->comp_info;
  for (; local_18 < cinfo->num_components; local_18 = local_18 + 1) {
    if (((*(int *)(samplesperrow + 8) < 1) || (4 < *(int *)(samplesperrow + 8))) ||
       ((*(int *)(samplesperrow + 0xc) < 1 || (4 < *(int *)(samplesperrow + 0xc))))) {
      cinfo->err->msg_code = 0x13;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    if (*(int *)(samplesperrow + 8) < cinfo->max_h_samp_factor) {
      local_48 = cinfo->max_h_samp_factor;
    }
    else {
      local_48 = *(int *)(samplesperrow + 8);
    }
    cinfo->max_h_samp_factor = local_48;
    if (*(int *)(samplesperrow + 0xc) < cinfo->max_v_samp_factor) {
      local_4c = cinfo->max_v_samp_factor;
    }
    else {
      local_4c = *(int *)(samplesperrow + 0xc);
    }
    cinfo->max_v_samp_factor = local_4c;
    samplesperrow = samplesperrow + 0x60;
  }
  local_18 = 0;
  samplesperrow = (long)cinfo->comp_info;
  for (; local_18 < cinfo->num_components; local_18 = local_18 + 1) {
    *(int *)(samplesperrow + 4) = local_18;
    *(int *)(samplesperrow + 0x24) = cinfo->min_DCT_h_scaled_size;
    *(int *)(samplesperrow + 0x28) = cinfo->min_DCT_v_scaled_size;
    iVar1 = *(int *)(samplesperrow + 0x24);
    iVar4 = *(int *)(samplesperrow + 0x28) * 2;
    if (iVar1 == iVar4 || SBORROW4(iVar1,iVar4) != iVar1 + *(int *)(samplesperrow + 0x28) * -2 < 0)
    {
      iVar1 = *(int *)(samplesperrow + 0x28);
      iVar4 = *(int *)(samplesperrow + 0x24) * 2;
      if (iVar1 != iVar4 && SBORROW4(iVar1,iVar4) == iVar1 + *(int *)(samplesperrow + 0x24) * -2 < 0
         ) {
        *(int *)(samplesperrow + 0x28) = *(int *)(samplesperrow + 0x24) << 1;
      }
    }
    else {
      *(int *)(samplesperrow + 0x24) = *(int *)(samplesperrow + 0x28) << 1;
    }
    lVar3 = jdiv_round_up((ulong)cinfo->jpeg_width * (long)*(int *)(samplesperrow + 8),
                          (long)(cinfo->max_h_samp_factor * cinfo->block_size));
    *(int *)(samplesperrow + 0x1c) = (int)lVar3;
    lVar3 = jdiv_round_up((ulong)cinfo->jpeg_height * (long)*(int *)(samplesperrow + 0xc),
                          (long)(cinfo->max_v_samp_factor * cinfo->block_size));
    *(int *)(samplesperrow + 0x20) = (int)lVar3;
    lVar3 = jdiv_round_up((ulong)cinfo->jpeg_width *
                          (long)(*(int *)(samplesperrow + 8) * *(int *)(samplesperrow + 0x24)),
                          (long)(cinfo->max_h_samp_factor * cinfo->block_size));
    *(int *)(samplesperrow + 0x2c) = (int)lVar3;
    lVar3 = jdiv_round_up((ulong)cinfo->jpeg_height *
                          (long)(*(int *)(samplesperrow + 0xc) * *(int *)(samplesperrow + 0x28)),
                          (long)(cinfo->max_v_samp_factor * cinfo->block_size));
    *(int *)(samplesperrow + 0x30) = (int)lVar3;
    *(undefined4 *)(samplesperrow + 0x34) = 1;
    samplesperrow = samplesperrow + 0x60;
  }
  lVar3 = jdiv_round_up((ulong)cinfo->jpeg_height,
                        (long)(cinfo->max_v_samp_factor * cinfo->block_size));
  cinfo->total_iMCU_rows = (JDIMENSION)lVar3;
  return;
}

Assistant:

LOCAL(void)
initial_setup (j_compress_ptr cinfo, boolean transcode_only)
/* Do computations that are needed before master selection phase */
{
  int ci, ssize;
  jpeg_component_info *compptr;
  long samplesperrow;
  JDIMENSION jd_samplesperrow;

  if (transcode_only)
    jpeg_calc_trans_dimensions(cinfo);
  else
    jpeg_calc_jpeg_dimensions(cinfo);

  /* Sanity check on block_size */
  if (cinfo->block_size < 1 || cinfo->block_size > 16)
    ERREXIT2(cinfo, JERR_BAD_DCTSIZE, cinfo->block_size, cinfo->block_size);

  /* Derive natural_order from block_size */
  switch (cinfo->block_size) {
  case 2: cinfo->natural_order = jpeg_natural_order2; break;
  case 3: cinfo->natural_order = jpeg_natural_order3; break;
  case 4: cinfo->natural_order = jpeg_natural_order4; break;
  case 5: cinfo->natural_order = jpeg_natural_order5; break;
  case 6: cinfo->natural_order = jpeg_natural_order6; break;
  case 7: cinfo->natural_order = jpeg_natural_order7; break;
  default: cinfo->natural_order = jpeg_natural_order; break;
  }

  /* Derive lim_Se from block_size */
  cinfo->lim_Se = cinfo->block_size < DCTSIZE ?
    cinfo->block_size * cinfo->block_size - 1 : DCTSIZE2-1;

  /* Sanity check on image dimensions */
  if (cinfo->jpeg_height <= 0 || cinfo->jpeg_width <= 0 ||
      cinfo->num_components <= 0 || cinfo->input_components <= 0)
    ERREXIT(cinfo, JERR_EMPTY_IMAGE);

  /* Make sure image isn't bigger than I can handle */
  if ((long) cinfo->jpeg_height > (long) JPEG_MAX_DIMENSION ||
      (long) cinfo->jpeg_width > (long) JPEG_MAX_DIMENSION)
    ERREXIT1(cinfo, JERR_IMAGE_TOO_BIG, (unsigned int) JPEG_MAX_DIMENSION);

  /* Width of an input scanline must be representable as JDIMENSION. */
  samplesperrow = (long) cinfo->image_width * (long) cinfo->input_components;
  jd_samplesperrow = (JDIMENSION) samplesperrow;
  if ((long) jd_samplesperrow != samplesperrow)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);

  /* For now, precision must match compiled-in value... */
  if (cinfo->data_precision != BITS_IN_JSAMPLE)
    ERREXIT1(cinfo, JERR_BAD_PRECISION, cinfo->data_precision);

  /* Check that number of components won't exceed internal array sizes */
  if (cinfo->num_components > MAX_COMPONENTS)
    ERREXIT2(cinfo, JERR_COMPONENT_COUNT, cinfo->num_components,
	     MAX_COMPONENTS);

  /* Compute maximum sampling factors; check factor validity */
  cinfo->max_h_samp_factor = 1;
  cinfo->max_v_samp_factor = 1;
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    if (compptr->h_samp_factor<=0 || compptr->h_samp_factor>MAX_SAMP_FACTOR ||
	compptr->v_samp_factor<=0 || compptr->v_samp_factor>MAX_SAMP_FACTOR)
      ERREXIT(cinfo, JERR_BAD_SAMPLING);
    cinfo->max_h_samp_factor = MAX(cinfo->max_h_samp_factor,
				   compptr->h_samp_factor);
    cinfo->max_v_samp_factor = MAX(cinfo->max_v_samp_factor,
				   compptr->v_samp_factor);
  }

  /* Compute dimensions of components */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Fill in the correct component_index value; don't rely on application */
    compptr->component_index = ci;
    /* In selecting the actual DCT scaling for each component, we try to
     * scale down the chroma components via DCT scaling rather than downsampling.
     * This saves time if the downsampler gets to use 1:1 scaling.
     * Note this code adapts subsampling ratios which are powers of 2.
     */
    ssize = 1;
#ifdef DCT_SCALING_SUPPORTED
    while (cinfo->min_DCT_h_scaled_size * ssize <=
	   (cinfo->do_fancy_downsampling ? DCTSIZE : DCTSIZE / 2) &&
	   (cinfo->max_h_samp_factor % (compptr->h_samp_factor * ssize * 2)) == 0) {
      ssize = ssize * 2;
    }
#endif
    compptr->DCT_h_scaled_size = cinfo->min_DCT_h_scaled_size * ssize;
    ssize = 1;
#ifdef DCT_SCALING_SUPPORTED
    while (cinfo->min_DCT_v_scaled_size * ssize <=
	   (cinfo->do_fancy_downsampling ? DCTSIZE : DCTSIZE / 2) &&
	   (cinfo->max_v_samp_factor % (compptr->v_samp_factor * ssize * 2)) == 0) {
      ssize = ssize * 2;
    }
#endif
    compptr->DCT_v_scaled_size = cinfo->min_DCT_v_scaled_size * ssize;

    /* We don't support DCT ratios larger than 2. */
    if (compptr->DCT_h_scaled_size > compptr->DCT_v_scaled_size * 2)
	compptr->DCT_h_scaled_size = compptr->DCT_v_scaled_size * 2;
    else if (compptr->DCT_v_scaled_size > compptr->DCT_h_scaled_size * 2)
	compptr->DCT_v_scaled_size = compptr->DCT_h_scaled_size * 2;

    /* Size in DCT blocks */
    compptr->width_in_blocks = (JDIMENSION)
      jdiv_round_up((long) cinfo->jpeg_width * (long) compptr->h_samp_factor,
		    (long) (cinfo->max_h_samp_factor * cinfo->block_size));
    compptr->height_in_blocks = (JDIMENSION)
      jdiv_round_up((long) cinfo->jpeg_height * (long) compptr->v_samp_factor,
		    (long) (cinfo->max_v_samp_factor * cinfo->block_size));
    /* Size in samples */
    compptr->downsampled_width = (JDIMENSION)
      jdiv_round_up((long) cinfo->jpeg_width *
		    (long) (compptr->h_samp_factor * compptr->DCT_h_scaled_size),
		    (long) (cinfo->max_h_samp_factor * cinfo->block_size));
    compptr->downsampled_height = (JDIMENSION)
      jdiv_round_up((long) cinfo->jpeg_height *
		    (long) (compptr->v_samp_factor * compptr->DCT_v_scaled_size),
		    (long) (cinfo->max_v_samp_factor * cinfo->block_size));
    /* Mark component needed (this flag isn't actually used for compression) */
    compptr->component_needed = TRUE;
  }

  /* Compute number of fully interleaved MCU rows (number of times that
   * main controller will call coefficient controller).
   */
  cinfo->total_iMCU_rows = (JDIMENSION)
    jdiv_round_up((long) cinfo->jpeg_height,
		  (long) (cinfo->max_v_samp_factor * cinfo->block_size));
}